

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

string * NetwTimeString_abi_cxx11_(string *__return_storage_ptr__,float runS)

{
  float fVar1;
  allocator<char> local_29;
  char s [20];
  
  fVar1 = runS - (float)((long)(runS / 3600.0) & 0xffffffff) * 3600.0;
  snprintf(s,0x14,"%u:%02u:%06.3f",
           (double)(fVar1 - (float)((long)(fVar1 / 60.0) & 0xffffffff) * 60.0));
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,s,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string NetwTimeString (float runS)
{
    // Extract hours, minutes, and seconds (incl. fractions) from runS
    const unsigned runH = unsigned(runS / 3600.0f);
    runS -= runH * 3600.0f;
    const unsigned runM = unsigned(runS / 60.0f);
    runS -= runM * 60.0f;

    // Convert to string
    char s[20];
    snprintf(s, sizeof(s), "%u:%02u:%06.3f",
             runH, runM, runS);
    return std::string(s);
}